

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_a<ncnn::BinaryOp_x86_avx512_functor::binary_op_ratan2>
               (float *ptr,float *ptr1,float *outptr,int size,int elempack)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  __m512 x;
  undefined1 auVar16 [64];
  __m512 y;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 (*pauVar78) [64];
  undefined1 auVar79 [16];
  int in_ECX;
  undefined1 (*in_RDX) [64];
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [64];
  int in_R8D;
  undefined1 auVar80 [32];
  float fVar81;
  undefined8 uVar82;
  undefined8 uVar83;
  undefined8 uVar84;
  undefined8 uVar85;
  undefined8 uVar86;
  undefined8 uVar87;
  undefined8 uVar88;
  undefined8 uVar89;
  __m128 _outp_2;
  __m128 _b_2;
  __m256 _outp_1;
  __m256 _b_1;
  __m512 _outp;
  __m512 _b;
  __m512 _a_512;
  __m256 _a_256;
  __m128 _a_128;
  int i;
  float a;
  binary_op_ratan2 op;
  __m256 special_result;
  __m256 negative_mask_full_x;
  __m256 normal_result;
  __m256 pi_additions;
  __m256 negative_mask_y;
  __m256 negative_mask_x;
  __m256 normal_mode;
  __m256 not_equal_zero_y;
  __m256 not_equal_zero_x;
  __m256 magic_half_pi;
  __m256 magic_pi;
  __m256 magic_negative_zero;
  __m256 magic_zero;
  __m256 output_approx;
  __m256 fourth_power_of_input_approx;
  __m256 square_of_input_approx;
  __m256 input_approx;
  __m256 is_small_input;
  __m256 absolute;
  __m256 negative_mask;
  __m256 magic_a8;
  __m256 magic_a7;
  __m256 magic_a6;
  __m256 magic_a5;
  __m256 magic_a4;
  __m256 magic_a3;
  __m256 magic_a2;
  __m256 magic_a1;
  __m256 magic_a0;
  __m256 magic_half_pi_1;
  __m256 magic_negative_one;
  __m256 magic_one;
  __m256 magic_negative_zero_1;
  __m128 special_result_1;
  __m128 negative_mask_full_x_1;
  __m128 normal_result_1;
  __m128 pi_additions_1;
  __m128 negative_mask_y_1;
  __m128 negative_mask_x_1;
  __m128 normal_mode_1;
  __m128 not_equal_zero_y_1;
  __m128 not_equal_zero_x_1;
  __m128 magic_half_pi_2;
  __m128 magic_pi_1;
  __m128 magic_negative_zero_2;
  __m128 magic_zero_1;
  __m128 output_approx_1;
  __m128 fourth_power_of_input_approx_1;
  __m128 square_of_input_approx_1;
  __m128 input_approx_1;
  __m128 is_small_input_1;
  __m128 absolute_1;
  __m128 negative_mask_1;
  __m128 magic_a8_1;
  __m128 magic_a7_1;
  __m128 magic_a6_1;
  __m128 magic_a5_1;
  __m128 magic_a4_1;
  __m128 magic_a3_1;
  __m128 magic_a2_1;
  __m128 magic_a1_1;
  __m128 magic_a0_1;
  __m128 magic_half_pi_3;
  __m128 magic_negative_one_1;
  __m128 magic_one_1;
  __m128 magic_negative_zero_3;
  undefined1 local_26c0 [64];
  undefined8 local_2630;
  undefined8 uStackY_2628;
  undefined8 local_2620;
  undefined8 uStackY_2618;
  undefined8 local_2610;
  undefined8 uStackY_2608;
  undefined1 local_2600 [32];
  undefined8 local_25e0;
  undefined8 uStackY_25d8;
  undefined8 uStackY_25d0;
  undefined8 uStackY_25c8;
  undefined8 local_25c0;
  undefined8 uStackY_25b8;
  undefined8 uStackY_25b0;
  undefined8 uStackY_25a8;
  undefined8 uStackY_25a0;
  undefined8 uStackY_2598;
  undefined8 uStackY_2590;
  undefined8 uStackY_2588;
  undefined8 local_2580;
  undefined8 uStackY_2578;
  undefined8 uStackY_2570;
  undefined8 uStackY_2568;
  undefined8 uStackY_2560;
  undefined8 uStackY_2558;
  undefined8 uStackY_2550;
  undefined8 uStackY_2548;
  undefined1 local_2540 [64];
  undefined8 local_2500;
  undefined8 uStackY_24f8;
  undefined8 uStackY_24f0;
  undefined8 uStackY_24e8;
  undefined8 local_24d0;
  undefined8 uStackY_24c8;
  int local_24bc;
  float local_24b8;
  undefined1 local_24b1 [5];
  int local_24ac;
  undefined1 (*local_24a8) [64];
  undefined1 (*local_24a0) [32];
  undefined1 (*local_2490) [32];
  undefined1 (*in_stack_ffffffffffffdb78) [64];
  undefined8 in_stack_ffffffffffffdb80;
  undefined8 in_stack_ffffffffffffdb88;
  undefined8 in_stack_ffffffffffffdb90;
  undefined8 in_stack_ffffffffffffdb98;
  undefined8 in_stack_ffffffffffffdba0;
  undefined8 in_stack_ffffffffffffdba8;
  undefined8 in_stack_ffffffffffffdbb0;
  undefined8 in_stack_ffffffffffffdbb8;
  undefined1 in_stack_ffffffffffffdbc0 [40];
  undefined1 (*in_stack_ffffffffffffdbe8) [64];
  undefined8 in_stack_ffffffffffffdbf0;
  undefined8 local_2300;
  undefined8 uStack_22f8;
  undefined8 uStack_22f0;
  undefined8 uStack_22e8;
  undefined8 local_22e0;
  undefined8 uStack_22d8;
  undefined8 uStack_22d0;
  undefined8 uStack_22c8;
  undefined8 local_2240;
  undefined8 uStack_2238;
  undefined8 uStack_2230;
  undefined8 uStack_2228;
  undefined8 local_2220;
  undefined8 uStack_2218;
  undefined8 uStack_2210;
  undefined8 uStack_2208;
  float local_2120;
  float fStack_211c;
  float fStack_2118;
  float fStack_2114;
  float fStack_2110;
  float fStack_210c;
  float fStack_2108;
  float fStack_2104;
  float local_2100;
  float fStack_20fc;
  float fStack_20f8;
  float fStack_20f4;
  float fStack_20f0;
  float fStack_20ec;
  float fStack_20e8;
  float fStack_20e4;
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 uStack_20b0;
  undefined8 uStack_20a8;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  undefined8 uStack_2030;
  undefined8 uStack_2028;
  undefined8 uStack_1ff0;
  undefined8 uStack_1fe8;
  undefined1 local_1c00 [32];
  undefined1 local_1be0 [32];
  undefined1 local_1bc0 [32];
  undefined1 local_1ba0 [32];
  undefined1 local_1b80 [32];
  undefined1 local_1b60 [32];
  undefined1 local_1b40 [32];
  undefined1 local_1b20 [32];
  float local_1b00;
  float fStack_1afc;
  float fStack_1af8;
  float fStack_1af4;
  float fStack_1af0;
  float fStack_1aec;
  float fStack_1ae8;
  float fStack_1ae4;
  float local_1ae0;
  float fStack_1adc;
  float fStack_1ad8;
  float fStack_1ad4;
  float fStack_1ad0;
  float fStack_1acc;
  float fStack_1ac8;
  float fStack_1ac4;
  undefined1 local_1ac0 [32];
  undefined1 local_1aa0 [32];
  undefined1 local_1a80 [32];
  undefined1 local_1a60 [32];
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  undefined8 local_1a20;
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  undefined8 uStack_1a08;
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  undefined8 local_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined8 local_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined1 local_18a0 [32];
  undefined1 local_1880 [8];
  float fStack_1878;
  float fStack_1874;
  float fStack_1870;
  float fStack_186c;
  float fStack_1868;
  float fStack_1864;
  float local_1860;
  float fStack_185c;
  float fStack_1858;
  float fStack_1854;
  float fStack_1850;
  float fStack_184c;
  float fStack_1848;
  float fStack_1844;
  undefined4 local_1834;
  undefined4 local_1830;
  undefined4 local_182c;
  undefined4 local_1828;
  undefined4 local_1824;
  undefined4 local_1820;
  undefined4 local_181c;
  undefined4 local_1818;
  undefined4 local_1814;
  undefined4 local_1810;
  undefined4 local_180c;
  undefined4 local_1808;
  undefined4 local_1804;
  undefined1 local_1800 [16];
  undefined1 auStack_17f0 [16];
  undefined4 local_17e0;
  undefined4 local_17dc;
  undefined4 local_17d8;
  undefined4 local_17d4;
  undefined4 local_17d0;
  undefined4 local_17cc;
  undefined4 local_17c8;
  undefined4 local_17c4;
  undefined1 local_17c0 [16];
  undefined1 auStack_17b0 [16];
  undefined4 local_17a0;
  undefined4 local_179c;
  undefined4 local_1798;
  undefined4 local_1794;
  undefined4 local_1790;
  undefined4 local_178c;
  undefined4 local_1788;
  undefined4 local_1784;
  undefined1 local_1780 [16];
  undefined1 auStack_1770 [16];
  undefined4 local_1760;
  undefined4 local_175c;
  undefined4 local_1758;
  undefined4 local_1754;
  undefined4 local_1750;
  undefined4 local_174c;
  undefined4 local_1748;
  undefined4 local_1744;
  undefined1 local_1740 [16];
  undefined1 auStack_1730 [16];
  undefined4 local_1720;
  undefined4 local_171c;
  undefined4 local_1718;
  undefined4 local_1714;
  undefined4 local_1710;
  undefined4 local_170c;
  undefined4 local_1708;
  undefined4 local_1704;
  undefined1 local_1700 [16];
  undefined1 auStack_16f0 [16];
  undefined4 local_16e0;
  undefined4 local_16dc;
  undefined4 local_16d8;
  undefined4 local_16d4;
  undefined4 local_16d0;
  undefined4 local_16cc;
  undefined4 local_16c8;
  undefined4 local_16c4;
  undefined1 local_16c0 [16];
  undefined1 auStack_16b0 [16];
  undefined4 local_16a0;
  undefined4 local_169c;
  undefined4 local_1698;
  undefined4 local_1694;
  undefined4 local_1690;
  undefined4 local_168c;
  undefined4 local_1688;
  undefined4 local_1684;
  undefined1 local_1680 [16];
  undefined1 auStack_1670 [16];
  undefined4 local_1660;
  undefined4 local_165c;
  undefined4 local_1658;
  undefined4 local_1654;
  undefined4 local_1650;
  undefined4 local_164c;
  undefined4 local_1648;
  undefined4 local_1644;
  undefined1 local_1640 [16];
  undefined1 auStack_1630 [16];
  undefined4 local_1620;
  undefined4 local_161c;
  undefined4 local_1618;
  undefined4 local_1614;
  undefined4 local_1610;
  undefined4 local_160c;
  undefined4 local_1608;
  undefined4 local_1604;
  undefined1 local_1600 [16];
  undefined1 auStack_15f0 [16];
  undefined4 local_15e0;
  undefined4 local_15dc;
  undefined4 local_15d8;
  undefined4 local_15d4;
  undefined4 local_15d0;
  undefined4 local_15cc;
  undefined4 local_15c8;
  undefined4 local_15c4;
  undefined1 local_15c0 [16];
  undefined1 auStack_15b0 [16];
  undefined4 local_15a0;
  undefined4 local_159c;
  undefined4 local_1598;
  undefined4 local_1594;
  undefined4 local_1590;
  undefined4 local_158c;
  undefined4 local_1588;
  undefined4 local_1584;
  undefined1 local_1580 [16];
  undefined1 auStack_1570 [16];
  undefined4 local_1560;
  undefined4 local_155c;
  undefined4 local_1558;
  undefined4 local_1554;
  undefined4 local_1550;
  undefined4 local_154c;
  undefined4 local_1548;
  undefined4 local_1544;
  undefined1 local_1540 [16];
  undefined1 auStack_1530 [16];
  undefined4 local_1520;
  undefined4 local_151c;
  undefined4 local_1518;
  undefined4 local_1514;
  undefined4 local_1510;
  undefined4 local_150c;
  undefined4 local_1508;
  undefined4 local_1504;
  undefined1 local_1500 [16];
  undefined1 auStack_14f0 [16];
  undefined4 local_14e0;
  undefined4 local_14dc;
  undefined4 local_14d8;
  undefined4 local_14d4;
  undefined4 local_14d0;
  undefined4 local_14cc;
  undefined4 local_14c8;
  undefined4 local_14c4;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 *local_13c0;
  undefined1 *local_13b8;
  float *local_13b0;
  undefined8 *local_13a8;
  undefined1 *local_13a0;
  float *local_1398;
  undefined8 *local_1390;
  undefined1 *local_1388;
  float *local_1380;
  undefined8 *local_1378;
  undefined1 *local_1370;
  float *local_1368;
  undefined8 *local_1360;
  undefined8 *local_1358;
  float *local_1350;
  undefined8 *local_1348;
  undefined1 *local_1340;
  float *local_1338;
  undefined8 *local_1330;
  undefined1 *local_1328;
  float *local_1320;
  undefined8 *local_1318;
  undefined8 *local_1310;
  float *local_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  float local_ee0;
  float fStack_edc;
  float fStack_ed8;
  float fStack_ed4;
  float fStack_ed0;
  float fStack_ecc;
  float fStack_ec8;
  float fStack_ec4;
  undefined1 local_ec0 [32];
  undefined1 local_ea0 [32];
  undefined1 local_e80 [32];
  undefined1 local_e60 [32];
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined1 local_d40 [32];
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 *local_cb8;
  undefined8 *local_cb0;
  undefined1 *local_ca8;
  undefined1 local_ca0 [16];
  undefined1 local_c90 [16];
  float local_c80;
  float fStack_c7c;
  float fStack_c78;
  float fStack_c74;
  undefined1 local_c70 [16];
  undefined1 local_c60 [16];
  undefined1 local_c50 [16];
  undefined1 local_c40 [16];
  undefined1 local_c30 [16];
  undefined1 local_c20 [16];
  undefined8 local_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 local_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 local_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 local_bb0;
  undefined8 uStack_ba8;
  undefined1 local_ba0 [8];
  float fStack_b98;
  float fStack_b94;
  undefined8 local_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 local_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 local_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined1 local_b30 [16];
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined1 local_b10 [16];
  undefined1 local_b00 [16];
  undefined8 local_af0;
  undefined8 uStack_ae8;
  undefined1 local_ae0 [16];
  undefined8 local_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 local_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 local_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined1 local_a70 [16];
  undefined1 local_a60 [16];
  undefined1 local_a50 [16];
  undefined1 local_a40 [16];
  undefined1 local_a30 [16];
  undefined1 local_a20 [16];
  undefined8 local_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 local_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 local_9d0;
  undefined8 uStack_9c8;
  undefined1 local_9c0 [16];
  undefined8 local_9b0;
  undefined8 uStack_9a8;
  undefined1 local_9a0 [16];
  undefined8 local_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 local_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined4 local_944;
  undefined4 local_940;
  undefined4 uStack_93c;
  undefined4 uStack_938;
  undefined4 uStack_934;
  undefined4 local_928;
  undefined4 local_924;
  undefined4 local_920;
  undefined4 uStack_91c;
  undefined4 uStack_918;
  undefined4 uStack_914;
  undefined4 local_908;
  undefined4 local_904;
  undefined4 local_900;
  undefined4 uStack_8fc;
  undefined4 uStack_8f8;
  undefined4 uStack_8f4;
  undefined4 local_8e8;
  undefined4 local_8e4;
  undefined4 local_8e0;
  undefined4 uStack_8dc;
  undefined4 uStack_8d8;
  undefined4 uStack_8d4;
  undefined4 local_8c4;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 local_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 local_890;
  undefined8 uStack_888;
  undefined1 local_880 [16];
  undefined1 local_870 [16];
  undefined1 local_860 [16];
  undefined1 local_850 [16];
  undefined1 local_840 [16];
  undefined1 local_830 [16];
  undefined1 local_820 [16];
  undefined1 local_810 [16];
  float local_800;
  float fStack_7fc;
  float fStack_7f8;
  float fStack_7f4;
  float local_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [16];
  undefined1 local_7d0 [16];
  undefined1 local_7c0 [16];
  undefined1 local_7b0 [16];
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 local_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 local_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 local_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 local_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 local_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float local_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined1 local_640 [16];
  undefined1 local_630 [16];
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 local_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined1 *local_5a0;
  undefined1 *local_598;
  float *local_590;
  undefined8 *local_588;
  undefined1 *local_580;
  float *local_578;
  undefined8 *local_570;
  undefined1 *local_568;
  float *local_560;
  undefined8 *local_558;
  undefined1 *local_550;
  float *local_548;
  undefined8 *local_540;
  undefined8 *local_538;
  float *local_530;
  undefined8 *local_528;
  undefined1 *local_520;
  float *local_518;
  undefined8 *local_510;
  undefined1 *local_508;
  float *local_500;
  undefined8 *local_4f8;
  undefined8 *local_4f0;
  float *local_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  float local_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined4 local_2d4;
  undefined4 local_2d0;
  undefined4 uStack_2cc;
  undefined4 uStack_2c8;
  undefined4 uStack_2c4;
  undefined4 local_2b8;
  undefined4 local_2b4;
  undefined4 local_2b0;
  undefined4 uStack_2ac;
  undefined4 uStack_2a8;
  undefined4 uStack_2a4;
  undefined4 local_298;
  undefined4 local_294;
  undefined4 local_290;
  undefined4 uStack_28c;
  undefined4 uStack_288;
  undefined4 uStack_284;
  undefined4 local_278;
  undefined4 local_274;
  undefined4 local_270;
  undefined4 uStack_26c;
  undefined4 uStack_268;
  undefined4 uStack_264;
  undefined4 local_258;
  undefined4 local_254;
  undefined4 local_250;
  undefined4 uStack_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  undefined4 local_238;
  undefined4 local_234;
  undefined4 local_230;
  undefined4 uStack_22c;
  undefined4 uStack_228;
  undefined4 uStack_224;
  undefined4 local_218;
  undefined4 local_214;
  undefined4 local_210;
  undefined4 uStack_20c;
  undefined4 uStack_208;
  undefined4 uStack_204;
  undefined4 local_1f8;
  undefined4 local_1f4;
  undefined4 local_1f0;
  undefined4 uStack_1ec;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  undefined4 local_1d8;
  undefined4 local_1d4;
  undefined4 local_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined4 local_1b8;
  undefined4 local_1b4;
  undefined4 local_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  undefined4 local_198;
  undefined4 local_194;
  undefined4 local_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  undefined4 local_178;
  undefined4 local_174;
  undefined4 local_170;
  undefined4 uStack_16c;
  undefined4 uStack_168;
  undefined4 uStack_164;
  undefined4 local_158;
  undefined4 local_154;
  undefined4 local_150;
  undefined4 uStack_14c;
  undefined4 uStack_148;
  undefined4 uStack_144;
  undefined4 local_134;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined1 local_b0 [16];
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined1 (*local_68) [32];
  float *local_60;
  undefined1 *local_58;
  
  local_24b8 = *(float *)*in_RDI;
  local_24bc = 0;
  if (in_R8D == 4) {
    local_2630 = *(undefined8 *)*in_RDI;
    uStackY_2628 = *(undefined8 *)(*in_RDI + 8);
  }
  else {
    local_2630 = CONCAT44(local_24b8,local_24b8);
    uStackY_2628 = CONCAT44(local_24b8,local_24b8);
  }
  local_24d0 = local_2630;
  uStackY_24c8 = uStackY_2628;
  local_2500 = local_2630;
  if (in_R8D == 8) {
    local_2500 = *(undefined8 *)*in_RDI;
  }
  if (in_R8D == 0x10) {
    local_26c0 = *in_RDI;
    in_stack_ffffffffffffdb78 = in_RDI;
  }
  else {
    auVar1._8_8_ = local_2500;
    auVar1._0_8_ = local_2500;
    auVar1._16_8_ = local_2500;
    auVar1._24_8_ = local_2500;
    local_26c0 = vinsertf64x4_avx512f
                           (ZEXT3264(CONCAT824(local_2500,
                                               CONCAT816(local_2500,CONCAT88(local_2500,local_2500))
                                              )),auVar1,1);
  }
  local_2540 = local_26c0;
  uStackY_24f8 = local_2500;
  uStackY_24f0 = local_2500;
  uStackY_24e8 = local_2500;
  local_24ac = in_ECX;
  pauVar78 = in_RDX;
  local_24a0 = in_RSI;
  for (; local_24a8 = pauVar78, local_24bc + 0xf < local_24ac; local_24bc = local_24bc + 0x10) {
    local_2490 = local_24a0;
    uVar82 = *(undefined8 *)*local_24a0;
    uVar83 = *(undefined8 *)(*local_24a0 + 8);
    uVar84 = *(undefined8 *)(*local_24a0 + 0x10);
    uVar85 = *(undefined8 *)(*local_24a0 + 0x18);
    uVar86 = *(undefined8 *)local_24a0[1];
    uVar87 = *(undefined8 *)(local_24a0[1] + 8);
    uVar88 = *(undefined8 *)(local_24a0[1] + 0x10);
    uVar89 = *(undefined8 *)(local_24a0[1] + 0x18);
    y[2] = (float)in_stack_ffffffffffffdbc0._0_4_;
    y[3] = (float)in_stack_ffffffffffffdbc0._4_4_;
    y[4] = (float)in_stack_ffffffffffffdbc0._8_4_;
    y[5] = (float)in_stack_ffffffffffffdbc0._12_4_;
    y[6] = (float)in_stack_ffffffffffffdbc0._16_4_;
    y[7] = (float)in_stack_ffffffffffffdbc0._20_4_;
    y[8] = (float)in_stack_ffffffffffffdbc0._24_4_;
    y[9] = (float)in_stack_ffffffffffffdbc0._28_4_;
    y[10] = (float)in_stack_ffffffffffffdbc0._32_4_;
    y[0xb] = (float)in_stack_ffffffffffffdbc0._36_4_;
    y[0] = (float)(int)in_stack_ffffffffffffdbb8;
    y[1] = (float)(int)((ulong)in_stack_ffffffffffffdbb8 >> 0x20);
    y._48_8_ = in_stack_ffffffffffffdbe8;
    y[0xe] = (float)(int)in_stack_ffffffffffffdbf0;
    y[0xf] = (float)(int)((ulong)in_stack_ffffffffffffdbf0 >> 0x20);
    x[2] = (float)(int)in_stack_ffffffffffffdb80;
    x[3] = (float)(int)((ulong)in_stack_ffffffffffffdb80 >> 0x20);
    x._0_8_ = in_stack_ffffffffffffdb78;
    x[4] = (float)(int)in_stack_ffffffffffffdb88;
    x[5] = (float)(int)((ulong)in_stack_ffffffffffffdb88 >> 0x20);
    x[6] = (float)(int)in_stack_ffffffffffffdb90;
    x[7] = (float)(int)((ulong)in_stack_ffffffffffffdb90 >> 0x20);
    x[8] = (float)(int)in_stack_ffffffffffffdb98;
    x[9] = (float)(int)((ulong)in_stack_ffffffffffffdb98 >> 0x20);
    x[10] = (float)(int)in_stack_ffffffffffffdba0;
    x[0xb] = (float)(int)((ulong)in_stack_ffffffffffffdba0 >> 0x20);
    x[0xc] = (float)(int)in_stack_ffffffffffffdba8;
    x[0xd] = (float)(int)((ulong)in_stack_ffffffffffffdba8 >> 0x20);
    x[0xe] = (float)(int)in_stack_ffffffffffffdbb0;
    x[0xf] = (float)(int)((ulong)in_stack_ffffffffffffdbb0 >> 0x20);
    local_2580 = uVar82;
    uStackY_2578 = uVar83;
    uStackY_2570 = uVar84;
    uStackY_2568 = uVar85;
    uStackY_2560 = uVar86;
    uStackY_2558 = uVar87;
    uStackY_2550 = uVar88;
    uStackY_2548 = uVar89;
    atan2512_ps(y,x);
    auVar16._8_8_ = uVar83;
    auVar16._0_8_ = uVar82;
    auVar16._16_8_ = uVar84;
    auVar16._24_8_ = uVar85;
    auVar16._32_8_ = uVar86;
    auVar16._40_8_ = uVar87;
    auVar16._48_8_ = uVar88;
    auVar16._56_8_ = uVar89;
    *local_24a8 = auVar16;
    local_24a0 = local_24a0 + 2;
    local_25c0 = uVar82;
    uStackY_25b8 = uVar83;
    uStackY_25b0 = uVar84;
    uStackY_25a8 = uVar85;
    uStackY_25a0 = uVar86;
    uStackY_2598 = uVar87;
    uStackY_2590 = uVar88;
    uStackY_2588 = uVar89;
    pauVar78 = local_24a8 + 1;
    in_stack_ffffffffffffdb80 = uVar82;
    in_stack_ffffffffffffdb88 = uVar83;
    in_stack_ffffffffffffdb90 = uVar84;
    in_stack_ffffffffffffdb98 = uVar85;
    in_stack_ffffffffffffdba0 = uVar86;
    in_stack_ffffffffffffdba8 = uVar87;
    in_stack_ffffffffffffdbb0 = uVar88;
    in_stack_ffffffffffffdbb8 = uVar89;
    in_stack_ffffffffffffdbe8 = local_24a8;
  }
  for (; local_24bc + 7 < local_24ac; local_24bc = local_24bc + 8) {
    local_25e0 = *(undefined8 *)*local_24a0;
    uStackY_25d8 = *(undefined8 *)(*local_24a0 + 8);
    uStackY_25d0 = *(undefined8 *)(*local_24a0 + 0x10);
    uStackY_25c8 = *(undefined8 *)(*local_24a0 + 0x18);
    auVar39._8_8_ = uStackY_24f8;
    auVar39._0_8_ = local_2500;
    auVar39._16_8_ = uStackY_24f0;
    auVar39._24_8_ = uStackY_24e8;
    auVar38._8_8_ = uStackY_24f8;
    auVar38._0_8_ = local_2500;
    auVar38._16_8_ = uStackY_24f0;
    auVar38._24_8_ = uStackY_24e8;
    auVar37._8_8_ = uStackY_24f8;
    auVar37._0_8_ = local_2500;
    auVar37._16_8_ = uStackY_24f0;
    auVar37._24_8_ = uStackY_24e8;
    auVar7._8_8_ = uStackY_24f8;
    auVar7._0_8_ = local_2500;
    auVar7._16_8_ = uStackY_24f0;
    auVar7._24_8_ = uStackY_24e8;
    auVar79 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
    auVar79 = vinsertps_avx(auVar79,ZEXT416(0),0x20);
    auVar79 = vinsertps_avx(auVar79,ZEXT416(0),0x30);
    auVar3 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0),0x20);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0),0x30);
    local_20c0 = auVar79._0_8_;
    uStack_20b8 = auVar79._8_8_;
    uStack_20b0 = auVar3._0_8_;
    uStack_20a8 = auVar3._8_8_;
    auVar3 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0x80000000),0x20);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0x80000000),0x30);
    auVar4 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
    auVar4 = vinsertps_avx(auVar4,ZEXT416(0x80000000),0x20);
    auVar4 = vinsertps_avx(auVar4,ZEXT416(0x80000000),0x30);
    uStack_2070 = auVar4._0_8_;
    uStack_2068 = auVar4._8_8_;
    auVar4 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
    auVar4 = vinsertps_avx(auVar4,ZEXT416(0x40490fdb),0x20);
    auVar4 = vinsertps_avx(auVar4,ZEXT416(0x40490fdb),0x30);
    auVar5 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
    auVar5 = vinsertps_avx(auVar5,ZEXT416(0x40490fdb),0x20);
    auVar5 = vinsertps_avx(auVar5,ZEXT416(0x40490fdb),0x30);
    uStack_2030 = auVar5._0_8_;
    uStack_2028 = auVar5._8_8_;
    auVar5 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
    auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3fc90fdb),0x20);
    auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3fc90fdb),0x30);
    auVar6 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
    auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3fc90fdb),0x20);
    auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3fc90fdb),0x30);
    uStack_1ff0 = auVar6._0_8_;
    uStack_1fe8 = auVar6._8_8_;
    auVar2._16_8_ = uStack_20b0;
    auVar2._0_16_ = auVar79;
    auVar2._24_8_ = uStack_20a8;
    auVar1 = vcmpps_avx(auVar7,auVar2,4);
    auVar80._16_8_ = uStack_20b0;
    auVar80._0_16_ = auVar79;
    auVar80._24_8_ = uStack_20a8;
    auVar2 = vcmpps_avx(*local_24a0,auVar80,4);
    local_2220 = auVar2._0_8_;
    uStack_2218 = auVar2._8_8_;
    uStack_2210 = auVar2._16_8_;
    uStack_2208 = auVar2._24_8_;
    auVar7 = vpand_avx2(auVar1,auVar2);
    auVar21._16_8_ = uStack_2070;
    auVar21._0_16_ = auVar3;
    auVar21._24_8_ = uStack_2068;
    auVar8 = vpand_avx2(auVar21,auVar37);
    auVar20._16_8_ = uStack_2070;
    auVar20._0_16_ = auVar3;
    auVar20._24_8_ = uStack_2068;
    auVar9 = vpand_avx2(auVar20,*local_24a0);
    auVar17._16_8_ = uStack_20b0;
    auVar17._0_16_ = auVar79;
    auVar17._24_8_ = uStack_20a8;
    auVar1 = vcmpps_avx(auVar38,auVar17,1);
    auVar80 = vcmpps_avx(*local_24a0,auVar17,1);
    auVar19._16_8_ = uStack_2070;
    auVar19._0_16_ = auVar3;
    auVar19._24_8_ = uStack_2068;
    auVar80 = vpand_avx2(auVar80,auVar19);
    auVar24._16_8_ = uStack_2030;
    auVar24._0_16_ = auVar4;
    auVar24._24_8_ = uStack_2028;
    auVar80 = vpor_avx2(auVar80,auVar24);
    auVar1 = vpand_avx2(auVar1,auVar80);
    local_18a0 = vdivps_avx(*local_24a0,auVar39);
    local_1804 = 0x80000000;
    local_17e0 = 0x80000000;
    auVar3 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0x80000000),0x20);
    local_1800 = vinsertps_avx(auVar3,ZEXT416(0x80000000),0x30);
    auVar3 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0x80000000),0x20);
    auStack_17f0 = vinsertps_avx(auVar3,ZEXT416(0x80000000),0x30);
    local_18c0 = local_1800._0_8_;
    uStack_18b8 = local_1800._8_8_;
    uStack_18b0 = auStack_17f0._0_8_;
    uStack_18a8 = auStack_17f0._8_8_;
    local_1808 = 0x3f800000;
    local_17a0 = 0x3f800000;
    auVar3 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x20);
    local_17c0 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x30);
    auVar3 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x20);
    auStack_17b0 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x30);
    local_18e0 = local_17c0._0_8_;
    uStack_18d8 = local_17c0._8_8_;
    uStack_18d0 = auStack_17b0._0_8_;
    uStack_18c8 = auStack_17b0._8_8_;
    local_180c = 0xbf800000;
    local_1760 = 0xbf800000;
    auVar3 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0xbf800000),0x20);
    local_1780 = vinsertps_avx(auVar3,ZEXT416(0xbf800000),0x30);
    auVar3 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0xbf800000),0x20);
    auStack_1770 = vinsertps_avx(auVar3,ZEXT416(0xbf800000),0x30);
    local_1900 = local_1780._0_8_;
    uStack_18f8 = local_1780._8_8_;
    uStack_18f0 = auStack_1770._0_8_;
    uStack_18e8 = auStack_1770._8_8_;
    local_1810 = 0x3fc90fdb;
    local_1720 = 0x3fc90fdb;
    auVar3 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3fc90fdb),0x20);
    local_1740 = vinsertps_avx(auVar3,ZEXT416(0x3fc90fdb),0x30);
    auVar3 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3fc90fdb),0x20);
    auStack_1730 = vinsertps_avx(auVar3,ZEXT416(0x3fc90fdb),0x30);
    local_1920 = local_1740._0_8_;
    uStack_1918 = local_1740._8_8_;
    uStack_1910 = auStack_1730._0_8_;
    uStack_1908 = auStack_1730._8_8_;
    local_1814 = 0x3f800000;
    local_16e0 = 0x3f800000;
    auVar3 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x20);
    local_1700 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x30);
    auVar3 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x20);
    auStack_16f0 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x30);
    local_1940 = local_1700._0_8_;
    uStack_1938 = local_1700._8_8_;
    uStack_1930 = auStack_16f0._0_8_;
    uStack_1928 = auStack_16f0._8_8_;
    local_1818 = 0xbeaaaa53;
    local_16a0 = 0xbeaaaa53;
    auVar3 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0xbeaaaa53),0x20);
    local_16c0 = vinsertps_avx(auVar3,ZEXT416(0xbeaaaa53),0x30);
    auVar3 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0xbeaaaa53),0x20);
    auStack_16b0 = vinsertps_avx(auVar3,ZEXT416(0xbeaaaa53),0x30);
    local_1960 = local_16c0._0_8_;
    uStack_1958 = local_16c0._8_8_;
    uStack_1950 = auStack_16b0._0_8_;
    uStack_1948 = auStack_16b0._8_8_;
    local_181c = 0x3e4cb974;
    local_1660 = 0x3e4cb974;
    auVar3 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3e4cb974),0x20);
    local_1680 = vinsertps_avx(auVar3,ZEXT416(0x3e4cb974),0x30);
    auVar3 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3e4cb974),0x20);
    auStack_1670 = vinsertps_avx(auVar3,ZEXT416(0x3e4cb974),0x30);
    local_1980 = local_1680._0_8_;
    uStack_1978 = local_1680._8_8_;
    uStack_1970 = auStack_1670._0_8_;
    uStack_1968 = auStack_1670._8_8_;
    local_1820 = 0xbe117200;
    local_1620 = 0xbe117200;
    auVar3 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0xbe117200),0x20);
    local_1640 = vinsertps_avx(auVar3,ZEXT416(0xbe117200),0x30);
    auVar3 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0xbe117200),0x20);
    auStack_1630 = vinsertps_avx(auVar3,ZEXT416(0xbe117200),0x30);
    local_19a0 = local_1640._0_8_;
    uStack_1998 = local_1640._8_8_;
    uStack_1990 = auStack_1630._0_8_;
    uStack_1988 = auStack_1630._8_8_;
    local_1824 = 0x3dd9ed24;
    local_15e0 = 0x3dd9ed24;
    auVar3 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3dd9ed24),0x20);
    local_1600 = vinsertps_avx(auVar3,ZEXT416(0x3dd9ed24),0x30);
    auVar3 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3dd9ed24),0x20);
    auStack_15f0 = vinsertps_avx(auVar3,ZEXT416(0x3dd9ed24),0x30);
    local_19c0 = local_1600._0_8_;
    uStack_19b8 = local_1600._8_8_;
    uStack_19b0 = auStack_15f0._0_8_;
    uStack_19a8 = auStack_15f0._8_8_;
    local_1828 = 0xbd99b01e;
    local_15a0 = 0xbd99b01e;
    auVar3 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0xbd99b01e),0x20);
    local_15c0 = vinsertps_avx(auVar3,ZEXT416(0xbd99b01e),0x30);
    auVar3 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0xbd99b01e),0x20);
    auStack_15b0 = vinsertps_avx(auVar3,ZEXT416(0xbd99b01e),0x30);
    local_19e0 = local_15c0._0_8_;
    uStack_19d8 = local_15c0._8_8_;
    uStack_19d0 = auStack_15b0._0_8_;
    uStack_19c8 = auStack_15b0._8_8_;
    local_182c = 0x3d2edd4e;
    local_1560 = 0x3d2edd4e;
    auVar3 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3d2edd4e),0x20);
    local_1580 = vinsertps_avx(auVar3,ZEXT416(0x3d2edd4e),0x30);
    auVar3 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3d2edd4e),0x20);
    auStack_1570 = vinsertps_avx(auVar3,ZEXT416(0x3d2edd4e),0x30);
    local_1a00 = local_1580._0_8_;
    uStack_19f8 = local_1580._8_8_;
    uStack_19f0 = auStack_1570._0_8_;
    uStack_19e8 = auStack_1570._8_8_;
    local_1830 = 0xbc83a25c;
    local_1520 = 0xbc83a25c;
    auVar3 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0xbc83a25c),0x20);
    local_1540 = vinsertps_avx(auVar3,ZEXT416(0xbc83a25c),0x30);
    auVar3 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0xbc83a25c),0x20);
    auStack_1530 = vinsertps_avx(auVar3,ZEXT416(0xbc83a25c),0x30);
    local_1a20 = local_1540._0_8_;
    uStack_1a18 = local_1540._8_8_;
    uStack_1a10 = auStack_1530._0_8_;
    uStack_1a08 = auStack_1530._8_8_;
    local_1834 = 0x3b3ac537;
    local_14e0 = 0x3b3ac537;
    auVar3 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3b3ac537),0x20);
    local_1500 = vinsertps_avx(auVar3,ZEXT416(0x3b3ac537),0x30);
    auVar3 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3b3ac537),0x20);
    auStack_14f0 = vinsertps_avx(auVar3,ZEXT416(0x3b3ac537),0x30);
    local_1a40 = local_1500._0_8_;
    uStack_1a38 = local_1500._8_8_;
    uStack_1a30 = auStack_14f0._0_8_;
    uStack_1a28 = auStack_14f0._8_8_;
    local_1220 = local_1800._0_8_;
    uStack_1218 = local_1800._8_8_;
    uStack_1210 = auStack_17f0._0_8_;
    uStack_1208 = auStack_17f0._8_8_;
    local_1240 = local_18a0._0_8_;
    uStack_1238 = local_18a0._8_8_;
    uStack_1230 = local_18a0._16_8_;
    uStack_1228 = local_18a0._24_8_;
    auVar28._16_8_ = auStack_17f0._0_8_;
    auVar28._0_16_ = local_1800;
    auVar28._24_8_ = auStack_17f0._8_8_;
    local_1a60 = vpand_avx2(auVar28,local_18a0);
    local_da0 = local_1800._0_8_;
    uStack_d98 = local_1800._8_8_;
    uStack_d90 = auStack_17f0._0_8_;
    uStack_d88 = auStack_17f0._8_8_;
    local_dc0 = local_18a0._0_8_;
    uStack_db8 = local_18a0._8_8_;
    uStack_db0 = local_18a0._16_8_;
    uStack_da8 = local_18a0._24_8_;
    auVar31._16_8_ = auStack_17f0._0_8_;
    auVar31._0_16_ = local_1800;
    auVar31._24_8_ = auStack_17f0._8_8_;
    local_1a80 = vpandn_avx2(auVar31,local_18a0);
    auVar25._16_8_ = auStack_17b0._0_8_;
    auVar25._0_16_ = local_17c0;
    auVar25._24_8_ = auStack_17b0._8_8_;
    local_1aa0 = vcmpps_avx(auVar25,local_1a80,1);
    local_1260 = local_1aa0._0_8_;
    uStack_1258 = local_1aa0._8_8_;
    uStack_1250 = local_1aa0._16_8_;
    uStack_1248 = local_1aa0._24_8_;
    local_1280 = local_1780._0_8_;
    uStack_1278 = local_1780._8_8_;
    uStack_1270 = auStack_1770._0_8_;
    uStack_1268 = auStack_1770._8_8_;
    auVar27._16_8_ = auStack_1770._0_8_;
    auVar27._0_16_ = local_1780;
    auVar27._24_8_ = auStack_1770._8_8_;
    local_e60 = vpand_avx2(local_1aa0,auVar27);
    local_de0 = local_1aa0._0_8_;
    uStack_dd8 = local_1aa0._8_8_;
    uStack_dd0 = local_1aa0._16_8_;
    uStack_dc8 = local_1aa0._24_8_;
    local_e00 = local_1a80._0_8_;
    uStack_df8 = local_1a80._8_8_;
    uStack_df0 = local_1a80._16_8_;
    uStack_de8 = local_1a80._24_8_;
    local_e80 = vpandn_avx2(local_1aa0,local_1a80);
    local_13e0 = vpor_avx2(local_e60,local_e80);
    local_12a0 = local_1aa0._0_8_;
    uStack_1298 = local_1aa0._8_8_;
    uStack_1290 = local_1aa0._16_8_;
    uStack_1288 = local_1aa0._24_8_;
    local_12c0 = local_1a80._0_8_;
    uStack_12b8 = local_1a80._8_8_;
    uStack_12b0 = local_1a80._16_8_;
    uStack_12a8 = local_1a80._24_8_;
    local_ea0 = vpand_avx2(local_1aa0,local_1a80);
    local_e20 = local_1aa0._0_8_;
    uStack_e18 = local_1aa0._8_8_;
    uStack_e10 = local_1aa0._16_8_;
    uStack_e08 = local_1aa0._24_8_;
    local_e40 = local_17c0._0_8_;
    uStack_e38 = local_17c0._8_8_;
    uStack_e30 = auStack_17b0._0_8_;
    uStack_e28 = auStack_17b0._8_8_;
    auVar30._16_8_ = auStack_17b0._0_8_;
    auVar30._0_16_ = local_17c0;
    auVar30._24_8_ = auStack_17b0._8_8_;
    local_ec0 = vpandn_avx2(local_1aa0,auVar30);
    local_1400 = vpor_avx2(local_ea0,local_ec0);
    local_1ac0 = vdivps_avx(local_13e0,local_1400);
    local_1440 = local_1ac0._0_8_;
    uStack_1438 = local_1ac0._8_8_;
    uStack_1430 = local_1ac0._16_8_;
    uStack_1428 = local_1ac0._24_8_;
    local_1420._0_4_ = local_1ac0._0_4_;
    local_1420._4_4_ = local_1ac0._4_4_;
    uStack_1418._0_4_ = local_1ac0._8_4_;
    uStack_1418._4_4_ = local_1ac0._12_4_;
    uStack_1410._0_4_ = local_1ac0._16_4_;
    uStack_1410._4_4_ = local_1ac0._20_4_;
    uStack_1408._0_4_ = local_1ac0._24_4_;
    uStack_1408._4_4_ = local_1ac0._28_4_;
    fStack_1ac4 = uStack_1408._4_4_;
    local_1ae0 = (float)local_1420 * (float)local_1420;
    fStack_1adc = local_1420._4_4_ * local_1420._4_4_;
    fStack_1ad8 = (float)uStack_1418 * (float)uStack_1418;
    fStack_1ad4 = uStack_1418._4_4_ * uStack_1418._4_4_;
    fStack_1ad0 = (float)uStack_1410 * (float)uStack_1410;
    fStack_1acc = uStack_1410._4_4_ * uStack_1410._4_4_;
    fStack_1ac8 = (float)uStack_1408 * (float)uStack_1408;
    local_1480 = CONCAT44(fStack_1adc,local_1ae0);
    uStack_1478 = CONCAT44(fStack_1ad4,fStack_1ad8);
    uStack_1470 = CONCAT44(fStack_1acc,fStack_1ad0);
    uStack_1468 = CONCAT44(uStack_1408._4_4_,fStack_1ac8);
    fStack_1ae4 = uStack_1408._4_4_;
    local_1b00 = local_1ae0 * local_1ae0;
    fStack_1afc = fStack_1adc * fStack_1adc;
    fStack_1af8 = fStack_1ad8 * fStack_1ad8;
    fStack_1af4 = fStack_1ad4 * fStack_1ad4;
    fStack_1af0 = fStack_1ad0 * fStack_1ad0;
    fStack_1aec = fStack_1acc * fStack_1acc;
    fStack_1ae8 = fStack_1ac8 * fStack_1ac8;
    local_1398 = &local_1b00;
    local_1310 = &local_1a20;
    local_1318 = &local_19e0;
    local_11c0 = CONCAT44(fStack_1afc,local_1b00);
    uStack_11b8 = CONCAT44(fStack_1af4,fStack_1af8);
    uStack_11b0 = CONCAT44(fStack_1aec,fStack_1af0);
    uStack_11a8 = CONCAT44(uStack_1408._4_4_,fStack_1ae8);
    auVar44._4_4_ = fStack_1afc;
    auVar44._0_4_ = local_1b00;
    auVar44._8_4_ = fStack_1af8;
    auVar44._12_4_ = fStack_1af4;
    auVar44._16_4_ = fStack_1af0;
    auVar44._20_4_ = fStack_1aec;
    auVar44._24_4_ = fStack_1ae8;
    auVar44._28_4_ = uStack_1408._4_4_;
    local_11e0 = local_1540._0_8_;
    uStack_11d8 = local_1540._8_8_;
    uStack_11d0 = auStack_1530._0_8_;
    uStack_11c8 = auStack_1530._8_8_;
    auVar53._16_8_ = auStack_1530._0_8_;
    auVar53._0_16_ = local_1540;
    auVar53._24_8_ = auStack_1530._8_8_;
    local_1200 = local_15c0._0_8_;
    uStack_11f8 = local_15c0._8_8_;
    uStack_11f0 = auStack_15b0._0_8_;
    uStack_11e8 = auStack_15b0._8_8_;
    auVar55._16_8_ = auStack_15b0._0_8_;
    auVar55._0_16_ = local_15c0;
    auVar55._24_8_ = auStack_15b0._8_8_;
    auVar3 = vfmadd213ps_fma(auVar53,auVar44,auVar55);
    local_1328 = local_1b80;
    local_1330 = &local_19a0;
    local_1160 = CONCAT44(fStack_1afc,local_1b00);
    uStack_1158 = CONCAT44(fStack_1af4,fStack_1af8);
    uStack_1150 = CONCAT44(fStack_1aec,fStack_1af0);
    uStack_1148 = CONCAT44(uStack_1408._4_4_,fStack_1ae8);
    auVar45._4_4_ = fStack_1afc;
    auVar45._0_4_ = local_1b00;
    auVar45._8_4_ = fStack_1af8;
    auVar45._12_4_ = fStack_1af4;
    auVar45._16_4_ = fStack_1af0;
    auVar45._20_4_ = fStack_1aec;
    auVar45._24_4_ = fStack_1ae8;
    auVar45._28_4_ = uStack_1408._4_4_;
    local_1b80._0_8_ = auVar3._0_8_;
    local_1180 = local_1b80._0_8_;
    local_1b80._8_8_ = auVar3._8_8_;
    uStack_1178 = local_1b80._8_8_;
    uStack_1170 = 0;
    uStack_1168 = 0;
    local_11a0 = local_1640._0_8_;
    uStack_1198 = local_1640._8_8_;
    uStack_1190 = auStack_1630._0_8_;
    uStack_1188 = auStack_1630._8_8_;
    auVar57._16_8_ = auStack_1630._0_8_;
    auVar57._0_16_ = local_1640;
    auVar57._24_8_ = auStack_1630._8_8_;
    auVar6 = vfmadd213ps_fma(ZEXT1632(auVar3),auVar45,auVar57);
    local_1340 = local_1b60;
    local_1348 = &local_1960;
    local_1100 = CONCAT44(fStack_1afc,local_1b00);
    uStack_10f8 = CONCAT44(fStack_1af4,fStack_1af8);
    uStack_10f0 = CONCAT44(fStack_1aec,fStack_1af0);
    uStack_10e8 = CONCAT44(uStack_1408._4_4_,fStack_1ae8);
    auVar46._4_4_ = fStack_1afc;
    auVar46._0_4_ = local_1b00;
    auVar46._8_4_ = fStack_1af8;
    auVar46._12_4_ = fStack_1af4;
    auVar46._16_4_ = fStack_1af0;
    auVar46._20_4_ = fStack_1aec;
    auVar46._24_4_ = fStack_1ae8;
    auVar46._28_4_ = uStack_1408._4_4_;
    local_1b60._0_8_ = auVar6._0_8_;
    local_1120 = local_1b60._0_8_;
    local_1b60._8_8_ = auVar6._8_8_;
    uStack_1118 = local_1b60._8_8_;
    uStack_1110 = 0;
    uStack_1108 = 0;
    local_1140 = local_16c0._0_8_;
    uStack_1138 = local_16c0._8_8_;
    uStack_1130 = auStack_16b0._0_8_;
    uStack_1128 = auStack_16b0._8_8_;
    auVar59._16_8_ = auStack_16b0._0_8_;
    auVar59._0_16_ = local_16c0;
    auVar59._24_8_ = auStack_16b0._8_8_;
    auVar10 = vfmadd213ps_fma(ZEXT1632(auVar6),auVar46,auVar59);
    local_1358 = &local_1a40;
    local_1360 = &local_1a00;
    local_10a0 = CONCAT44(fStack_1afc,local_1b00);
    uStack_1098 = CONCAT44(fStack_1af4,fStack_1af8);
    uStack_1090 = CONCAT44(fStack_1aec,fStack_1af0);
    uStack_1088 = CONCAT44(uStack_1408._4_4_,fStack_1ae8);
    auVar47._4_4_ = fStack_1afc;
    auVar47._0_4_ = local_1b00;
    auVar47._8_4_ = fStack_1af8;
    auVar47._12_4_ = fStack_1af4;
    auVar47._16_4_ = fStack_1af0;
    auVar47._20_4_ = fStack_1aec;
    auVar47._24_4_ = fStack_1ae8;
    auVar47._28_4_ = uStack_1408._4_4_;
    local_10c0 = local_1500._0_8_;
    uStack_10b8 = local_1500._8_8_;
    uStack_10b0 = auStack_14f0._0_8_;
    uStack_10a8 = auStack_14f0._8_8_;
    auVar52._16_8_ = auStack_14f0._0_8_;
    auVar52._0_16_ = local_1500;
    auVar52._24_8_ = auStack_14f0._8_8_;
    local_10e0 = local_1580._0_8_;
    uStack_10d8 = local_1580._8_8_;
    uStack_10d0 = auStack_1570._0_8_;
    uStack_10c8 = auStack_1570._8_8_;
    auVar54._16_8_ = auStack_1570._0_8_;
    auVar54._0_16_ = local_1580;
    auVar54._24_8_ = auStack_1570._8_8_;
    auVar11 = vfmadd213ps_fma(auVar52,auVar47,auVar54);
    local_1370 = local_1c00;
    local_1378 = &local_19c0;
    local_1040 = CONCAT44(fStack_1afc,local_1b00);
    uStack_1038 = CONCAT44(fStack_1af4,fStack_1af8);
    uStack_1030 = CONCAT44(fStack_1aec,fStack_1af0);
    uStack_1028 = CONCAT44(uStack_1408._4_4_,fStack_1ae8);
    auVar48._4_4_ = fStack_1afc;
    auVar48._0_4_ = local_1b00;
    auVar48._8_4_ = fStack_1af8;
    auVar48._12_4_ = fStack_1af4;
    auVar48._16_4_ = fStack_1af0;
    auVar48._20_4_ = fStack_1aec;
    auVar48._24_4_ = fStack_1ae8;
    auVar48._28_4_ = uStack_1408._4_4_;
    local_1c00._0_8_ = auVar11._0_8_;
    local_1060 = local_1c00._0_8_;
    local_1c00._8_8_ = auVar11._8_8_;
    uStack_1058 = local_1c00._8_8_;
    uStack_1050 = 0;
    uStack_1048 = 0;
    local_1080 = local_1600._0_8_;
    uStack_1078 = local_1600._8_8_;
    uStack_1070 = auStack_15f0._0_8_;
    uStack_1068 = auStack_15f0._8_8_;
    auVar56._16_8_ = auStack_15f0._0_8_;
    auVar56._0_16_ = local_1600;
    auVar56._24_8_ = auStack_15f0._8_8_;
    auVar12 = vfmadd213ps_fma(ZEXT1632(auVar11),auVar48,auVar56);
    local_1388 = local_1be0;
    local_1390 = &local_1980;
    local_fe0 = CONCAT44(fStack_1afc,local_1b00);
    uStack_fd8 = CONCAT44(fStack_1af4,fStack_1af8);
    uStack_fd0 = CONCAT44(fStack_1aec,fStack_1af0);
    uStack_fc8 = CONCAT44(uStack_1408._4_4_,fStack_1ae8);
    auVar49._4_4_ = fStack_1afc;
    auVar49._0_4_ = local_1b00;
    auVar49._8_4_ = fStack_1af8;
    auVar49._12_4_ = fStack_1af4;
    auVar49._16_4_ = fStack_1af0;
    auVar49._20_4_ = fStack_1aec;
    auVar49._24_4_ = fStack_1ae8;
    auVar49._28_4_ = uStack_1408._4_4_;
    local_1be0._0_8_ = auVar12._0_8_;
    local_1000 = local_1be0._0_8_;
    local_1be0._8_8_ = auVar12._8_8_;
    uStack_ff8 = local_1be0._8_8_;
    uStack_ff0 = 0;
    uStack_fe8 = 0;
    local_1020 = local_1680._0_8_;
    uStack_1018 = local_1680._8_8_;
    uStack_1010 = auStack_1670._0_8_;
    uStack_1008 = auStack_1670._8_8_;
    auVar58._16_8_ = auStack_1670._0_8_;
    auVar58._0_16_ = local_1680;
    auVar58._24_8_ = auStack_1670._8_8_;
    auVar13 = vfmadd213ps_fma(ZEXT1632(auVar12),auVar49,auVar58);
    local_13a0 = local_1bc0;
    local_13a8 = &local_1940;
    local_f80 = CONCAT44(fStack_1afc,local_1b00);
    uStack_f78 = CONCAT44(fStack_1af4,fStack_1af8);
    uStack_f70 = CONCAT44(fStack_1aec,fStack_1af0);
    uStack_f68 = CONCAT44(uStack_1408._4_4_,fStack_1ae8);
    auVar50._4_4_ = fStack_1afc;
    auVar50._0_4_ = local_1b00;
    auVar50._8_4_ = fStack_1af8;
    auVar50._12_4_ = fStack_1af4;
    auVar50._16_4_ = fStack_1af0;
    auVar50._20_4_ = fStack_1aec;
    auVar50._24_4_ = fStack_1ae8;
    auVar50._28_4_ = uStack_1408._4_4_;
    local_1bc0._0_8_ = auVar13._0_8_;
    local_fa0 = local_1bc0._0_8_;
    local_1bc0._8_8_ = auVar13._8_8_;
    uStack_f98 = local_1bc0._8_8_;
    uStack_f90 = 0;
    uStack_f88 = 0;
    local_fc0 = local_1700._0_8_;
    uStack_fb8 = local_1700._8_8_;
    uStack_fb0 = auStack_16f0._0_8_;
    uStack_fa8 = auStack_16f0._8_8_;
    auVar60._16_8_ = auStack_16f0._0_8_;
    auVar60._0_16_ = local_1700;
    auVar60._24_8_ = auStack_16f0._8_8_;
    auVar14 = vfmadd213ps_fma(ZEXT1632(auVar13),auVar50,auVar60);
    local_13b0 = &local_1ae0;
    local_13b8 = local_1b40;
    local_13c0 = local_1ba0;
    local_f20 = CONCAT44(fStack_1adc,local_1ae0);
    uStack_f18 = CONCAT44(fStack_1ad4,fStack_1ad8);
    uStack_f10 = CONCAT44(fStack_1acc,fStack_1ad0);
    uStack_f08 = CONCAT44(uStack_1408._4_4_,fStack_1ac8);
    auVar51._4_4_ = fStack_1adc;
    auVar51._0_4_ = local_1ae0;
    auVar51._8_4_ = fStack_1ad8;
    auVar51._12_4_ = fStack_1ad4;
    auVar51._16_4_ = fStack_1ad0;
    auVar51._20_4_ = fStack_1acc;
    auVar51._24_4_ = fStack_1ac8;
    auVar51._28_4_ = uStack_1408._4_4_;
    local_1b40._0_8_ = auVar10._0_8_;
    local_f40 = local_1b40._0_8_;
    local_1b40._8_8_ = auVar10._8_8_;
    uStack_f38 = local_1b40._8_8_;
    uStack_f30 = 0;
    uStack_f28 = 0;
    local_1ba0._0_8_ = auVar14._0_8_;
    local_f60 = local_1ba0._0_8_;
    local_1ba0._8_8_ = auVar14._8_8_;
    uStack_f58 = local_1ba0._8_8_;
    uStack_f50 = 0;
    uStack_f48 = 0;
    auVar15 = vfmadd213ps_fma(ZEXT1632(auVar10),auVar51,ZEXT1632(auVar14));
    local_1b20._0_8_ = auVar15._0_8_;
    uVar82 = local_1b20._0_8_;
    local_1b20._8_8_ = auVar15._8_8_;
    uVar83 = local_1b20._8_8_;
    uStack_1490 = 0;
    uStack_1488 = 0;
    local_14c0 = local_1ac0._0_8_;
    uStack_14b8 = local_1ac0._8_8_;
    uStack_14b0 = local_1ac0._16_8_;
    uStack_14a8 = local_1ac0._24_8_;
    local_14a0._0_4_ = auVar15._0_4_;
    local_14a0._4_4_ = auVar15._4_4_;
    uStack_1498._0_4_ = auVar15._8_4_;
    uStack_1498._4_4_ = auVar15._12_4_;
    fStack_1844 = uStack_1408._4_4_;
    local_1860 = (float)local_14a0 * (float)local_1420;
    fStack_185c = local_14a0._4_4_ * local_1420._4_4_;
    fStack_1858 = (float)uStack_1498 * (float)uStack_1418;
    fStack_1854 = uStack_1498._4_4_ * uStack_1418._4_4_;
    fStack_1850 = (float)uStack_1410 * 0.0;
    fStack_184c = uStack_1410._4_4_ * 0.0;
    fStack_1848 = (float)uStack_1408 * 0.0;
    local_12e0 = local_1aa0._0_8_;
    uStack_12d8 = local_1aa0._8_8_;
    uStack_12d0 = local_1aa0._16_8_;
    uStack_12c8 = local_1aa0._24_8_;
    local_1300 = local_1740._0_8_;
    uStack_12f8 = local_1740._8_8_;
    uStack_12f0 = auStack_1730._0_8_;
    uStack_12e8 = auStack_1730._8_8_;
    auVar26._16_8_ = auStack_1730._0_8_;
    auVar26._0_16_ = local_1740;
    auVar26._24_8_ = auStack_1730._8_8_;
    _local_1880 = vpand_avx2(local_1aa0,auVar26);
    local_ee0 = local_1860 + (float)local_1880._0_4_;
    fStack_edc = fStack_185c + (float)local_1880._4_4_;
    fStack_ed8 = fStack_1858 + fStack_1878;
    fStack_ed4 = fStack_1854 + fStack_1874;
    fStack_ed0 = fStack_1850 + fStack_1870;
    fStack_ecc = fStack_184c + fStack_186c;
    fStack_ec8 = fStack_1848 + fStack_1868;
    fStack_ec4 = uStack_1408._4_4_ + fStack_1864;
    local_f00 = local_1a60._0_8_;
    uStack_ef8 = local_1a60._8_8_;
    uStack_ef0 = local_1a60._16_8_;
    uStack_ee8 = local_1a60._24_8_;
    auVar29._4_4_ = fStack_edc;
    auVar29._0_4_ = local_ee0;
    auVar29._8_4_ = fStack_ed8;
    auVar29._12_4_ = fStack_ed4;
    auVar29._16_4_ = fStack_ed0;
    auVar29._20_4_ = fStack_ecc;
    auVar29._24_4_ = fStack_ec8;
    auVar29._28_4_ = fStack_ec4;
    auVar80 = vpor_avx2(auVar29,local_1a60);
    local_2100 = auVar80._0_4_;
    fStack_20fc = auVar80._4_4_;
    fStack_20f8 = auVar80._8_4_;
    fStack_20f4 = auVar80._12_4_;
    fStack_20f0 = auVar80._16_4_;
    fStack_20ec = auVar80._20_4_;
    fStack_20e8 = auVar80._24_4_;
    fStack_20e4 = auVar80._28_4_;
    local_2120 = auVar1._0_4_;
    fStack_211c = auVar1._4_4_;
    fStack_2118 = auVar1._8_4_;
    fStack_2114 = auVar1._12_4_;
    fStack_2110 = auVar1._16_4_;
    fStack_210c = auVar1._20_4_;
    fStack_2108 = auVar1._24_4_;
    fStack_2104 = auVar1._28_4_;
    auVar23._16_8_ = uStack_2030;
    auVar23._0_16_ = auVar4;
    auVar23._24_8_ = uStack_2028;
    auVar1 = vpor_avx2(auVar8,auVar23);
    auVar8._16_8_ = uStack_20b0;
    auVar8._0_16_ = auVar79;
    auVar8._24_8_ = uStack_20a8;
    auVar1 = vcmpps_avx(auVar1,auVar8,1);
    auVar22._16_8_ = uStack_1ff0;
    auVar22._0_16_ = auVar5;
    auVar22._24_8_ = uStack_1fe8;
    auVar80 = vpor_avx2(auVar9,auVar22);
    auVar80 = vpand_avx2(auVar2,auVar80);
    local_d20 = local_2220;
    uStack_d18 = uStack_2218;
    uStack_d10 = uStack_2210;
    uStack_d08 = uStack_2208;
    local_22e0 = auVar1._0_8_;
    uStack_22d8 = auVar1._8_8_;
    uStack_22d0 = auVar1._16_8_;
    uStack_22c8 = auVar1._24_8_;
    auVar18._16_8_ = uStack_2030;
    auVar18._0_16_ = auVar4;
    auVar18._24_8_ = uStack_2028;
    auVar8 = vpand_avx2(auVar1,auVar18);
    local_ce0 = local_22e0;
    uStack_cd8 = uStack_22d8;
    uStack_cd0 = uStack_22d0;
    uStack_cc8 = uStack_22c8;
    local_d00 = local_20c0;
    uStack_cf8 = uStack_20b8;
    uStack_cf0 = uStack_20b0;
    uStack_ce8 = uStack_20a8;
    auVar32._16_8_ = uStack_20b0;
    auVar32._0_16_ = auVar79;
    auVar32._24_8_ = uStack_20a8;
    auVar1 = vpandn_avx2(auVar1,auVar32);
    local_d40 = vpor_avx2(auVar8,auVar1);
    auVar1 = vpandn_avx2(auVar2,local_d40);
    auVar2 = vpor_avx2(auVar80,auVar1);
    local_2240 = auVar7._0_8_;
    uStack_2238 = auVar7._8_8_;
    uStack_2230 = auVar7._16_8_;
    uStack_2228 = auVar7._24_8_;
    auVar9._4_4_ = fStack_20fc + fStack_211c;
    auVar9._0_4_ = local_2100 + local_2120;
    auVar9._12_4_ = fStack_20f4 + fStack_2114;
    auVar9._8_4_ = fStack_20f8 + fStack_2118;
    auVar9._20_4_ = fStack_20ec + fStack_210c;
    auVar9._16_4_ = fStack_20f0 + fStack_2110;
    auVar9._28_4_ = fStack_20e4 + fStack_2104;
    auVar9._24_4_ = fStack_20e8 + fStack_2108;
    auVar1 = vpand_avx2(auVar7,auVar9);
    local_d60 = local_2240;
    uStack_d58 = uStack_2238;
    uStack_d50 = uStack_2230;
    uStack_d48 = uStack_2228;
    local_2300 = auVar2._0_8_;
    local_d80 = local_2300;
    uStack_22f8 = auVar2._8_8_;
    uStack_d78 = uStack_22f8;
    uStack_22f0 = auVar2._16_8_;
    uStack_d70 = uStack_22f0;
    uStack_22e8 = auVar2._24_8_;
    uStack_d68 = uStack_22e8;
    auVar80 = vpternlogq_avx512vl(auVar7,auVar7,auVar7,0xf);
    auVar2 = vpand_avx2(auVar80,auVar2);
    local_2600 = vpor_avx2(auVar1,auVar2);
    *(undefined8 *)*local_24a8 = local_2600._0_8_;
    *(undefined8 *)(*local_24a8 + 8) = local_2600._8_8_;
    *(undefined8 *)(*local_24a8 + 0x10) = local_2600._16_8_;
    *(undefined8 *)(*local_24a8 + 0x18) = local_2600._24_8_;
    local_24a0 = local_24a0 + 1;
    local_24a8 = (undefined1 (*) [64])(*local_24a8 + 0x20);
    local_1c00 = ZEXT1632(auVar11);
    local_1be0 = ZEXT1632(auVar12);
    local_1bc0 = ZEXT1632(auVar13);
    local_1ba0 = ZEXT1632(auVar14);
    local_1b80 = ZEXT1632(auVar3);
    local_1b60 = ZEXT1632(auVar6);
    local_1b40 = ZEXT1632(auVar10);
    local_1b20 = ZEXT1632(auVar15);
    local_17dc = local_17e0;
    local_17d8 = local_17e0;
    local_17d4 = local_17e0;
    local_17d0 = local_17e0;
    local_17cc = local_17e0;
    local_17c8 = local_17e0;
    local_17c4 = local_17e0;
    local_179c = local_17a0;
    local_1798 = local_17a0;
    local_1794 = local_17a0;
    local_1790 = local_17a0;
    local_178c = local_17a0;
    local_1788 = local_17a0;
    local_1784 = local_17a0;
    local_175c = local_1760;
    local_1758 = local_1760;
    local_1754 = local_1760;
    local_1750 = local_1760;
    local_174c = local_1760;
    local_1748 = local_1760;
    local_1744 = local_1760;
    local_171c = local_1720;
    local_1718 = local_1720;
    local_1714 = local_1720;
    local_1710 = local_1720;
    local_170c = local_1720;
    local_1708 = local_1720;
    local_1704 = local_1720;
    local_16dc = local_16e0;
    local_16d8 = local_16e0;
    local_16d4 = local_16e0;
    local_16d0 = local_16e0;
    local_16cc = local_16e0;
    local_16c8 = local_16e0;
    local_16c4 = local_16e0;
    local_169c = local_16a0;
    local_1698 = local_16a0;
    local_1694 = local_16a0;
    local_1690 = local_16a0;
    local_168c = local_16a0;
    local_1688 = local_16a0;
    local_1684 = local_16a0;
    local_165c = local_1660;
    local_1658 = local_1660;
    local_1654 = local_1660;
    local_1650 = local_1660;
    local_164c = local_1660;
    local_1648 = local_1660;
    local_1644 = local_1660;
    local_161c = local_1620;
    local_1618 = local_1620;
    local_1614 = local_1620;
    local_1610 = local_1620;
    local_160c = local_1620;
    local_1608 = local_1620;
    local_1604 = local_1620;
    local_15dc = local_15e0;
    local_15d8 = local_15e0;
    local_15d4 = local_15e0;
    local_15d0 = local_15e0;
    local_15cc = local_15e0;
    local_15c8 = local_15e0;
    local_15c4 = local_15e0;
    local_159c = local_15a0;
    local_1598 = local_15a0;
    local_1594 = local_15a0;
    local_1590 = local_15a0;
    local_158c = local_15a0;
    local_1588 = local_15a0;
    local_1584 = local_15a0;
    local_155c = local_1560;
    local_1558 = local_1560;
    local_1554 = local_1560;
    local_1550 = local_1560;
    local_154c = local_1560;
    local_1548 = local_1560;
    local_1544 = local_1560;
    local_151c = local_1520;
    local_1518 = local_1520;
    local_1514 = local_1520;
    local_1510 = local_1520;
    local_150c = local_1520;
    local_1508 = local_1520;
    local_1504 = local_1520;
    local_14dc = local_14e0;
    local_14d8 = local_14e0;
    local_14d4 = local_14e0;
    local_14d0 = local_14e0;
    local_14cc = local_14e0;
    local_14c8 = local_14e0;
    local_14c4 = local_14e0;
    local_14a0 = uVar82;
    uStack_1498 = uVar83;
    local_1460 = local_1480;
    uStack_1458 = uStack_1478;
    uStack_1450 = uStack_1470;
    uStack_1448 = uStack_1468;
    local_1420 = local_1440;
    uStack_1418 = uStack_1438;
    uStack_1410 = uStack_1430;
    uStack_1408 = uStack_1428;
    local_1380 = local_1398;
    local_1368 = local_1398;
    local_1350 = local_1398;
    local_1338 = local_1398;
    local_1320 = local_1398;
    local_1308 = local_1398;
  }
  for (; local_24bc + 3 < local_24ac; local_24bc = local_24bc + 4) {
    local_2610 = *(undefined8 *)*local_24a0;
    uStackY_2608 = *(undefined8 *)(*local_24a0 + 8);
    local_ca8 = local_24b1;
    local_cb0 = &local_24d0;
    local_cb8 = &local_2610;
    local_bd0 = local_24d0;
    uStack_bc8 = uStackY_24c8;
    auVar43._8_8_ = uStackY_24c8;
    auVar43._0_8_ = local_24d0;
    auVar42._8_8_ = uStackY_24c8;
    auVar42._0_8_ = local_24d0;
    auVar41._8_8_ = uStackY_24c8;
    auVar41._0_8_ = local_24d0;
    auVar40._8_8_ = uStackY_24c8;
    auVar40._0_8_ = local_24d0;
    local_8e4 = 0;
    local_8c4 = 0;
    local_8e0 = 0;
    local_be0 = 0;
    uStack_bd8 = 0;
    local_904 = 0x80000000;
    local_8e8 = 0x80000000;
    local_900 = 0x80000000;
    local_bf0 = 0x8000000080000000;
    uStack_be8 = 0x8000000080000000;
    local_924 = 0x40490fdb;
    local_908 = 0x40490fdb;
    local_920 = 0x40490fdb;
    local_c00 = 0x40490fdb40490fdb;
    uStack_bf8 = 0x40490fdb40490fdb;
    local_944 = 0x3fc90fdb;
    local_928 = 0x3fc90fdb;
    local_940 = 0x3fc90fdb;
    local_c10 = 0x3fc90fdb3fc90fdb;
    uStack_c08 = 0x3fc90fdb3fc90fdb;
    local_c20 = vcmpps_avx(auVar40,ZEXT816(0),4);
    local_c30 = vcmpps_avx(*(undefined1 (*) [16])*local_24a0,ZEXT816(0),4);
    local_a80 = local_c20._0_8_;
    uStack_a78 = local_c20._8_8_;
    local_a90 = local_c30._0_8_;
    uStack_a88 = local_c30._8_8_;
    local_c40 = vpand_avx(local_c20,local_c30);
    auVar6._8_8_ = 0x8000000080000000;
    auVar6._0_8_ = 0x8000000080000000;
    local_c50 = vpand_avx(auVar6,auVar41);
    auVar5._8_8_ = 0x8000000080000000;
    auVar5._0_8_ = 0x8000000080000000;
    local_c60 = vpand_avx(auVar5,*(undefined1 (*) [16])*local_24a0);
    local_b00 = vcmpps_avx(auVar42,ZEXT816(0),1);
    local_ae0 = vcmpps_avx(*(undefined1 (*) [16])*local_24a0,ZEXT816(0),1);
    auVar4._8_8_ = 0x8000000080000000;
    auVar4._0_8_ = 0x8000000080000000;
    local_9c0 = vpand_avx(local_ae0,auVar4);
    auVar12._8_8_ = 0x40490fdb40490fdb;
    auVar12._0_8_ = 0x40490fdb40490fdb;
    local_b10 = vpor_avx(local_9c0,auVar12);
    local_c70 = vpand_avx(local_b00,local_b10);
    local_6d0 = vdivps_avx(*(undefined1 (*) [16])*local_24a0,auVar43);
    local_154 = 0x80000000;
    local_134 = 0x80000000;
    local_150 = 0x80000000;
    local_6e0 = 0x8000000080000000;
    uStack_6d8 = 0x8000000080000000;
    local_174 = 0x3f800000;
    local_158 = 0x3f800000;
    local_170 = 0x3f800000;
    local_6f0 = 0x3f8000003f800000;
    uStack_6e8 = 0x3f8000003f800000;
    local_194 = 0xbf800000;
    local_178 = 0xbf800000;
    local_190 = 0xbf800000;
    local_700 = 0xbf800000bf800000;
    uStack_6f8 = 0xbf800000bf800000;
    local_1b4 = 0x3fc90fdb;
    local_198 = 0x3fc90fdb;
    local_1b0 = 0x3fc90fdb;
    local_710 = 0x3fc90fdb3fc90fdb;
    uStack_708 = 0x3fc90fdb3fc90fdb;
    local_1d4 = 0x3f800000;
    local_1b8 = 0x3f800000;
    local_1d0 = 0x3f800000;
    local_720 = 0x3f8000003f800000;
    uStack_718 = 0x3f8000003f800000;
    local_1f4 = 0xbeaaaa53;
    local_1d8 = 0xbeaaaa53;
    local_1f0 = 0xbeaaaa53;
    local_730 = 0xbeaaaa53beaaaa53;
    uStack_728 = 0xbeaaaa53beaaaa53;
    local_214 = 0x3e4cb974;
    local_1f8 = 0x3e4cb974;
    local_210 = 0x3e4cb974;
    local_740 = 0x3e4cb9743e4cb974;
    uStack_738 = 0x3e4cb9743e4cb974;
    local_234 = 0xbe117200;
    local_218 = 0xbe117200;
    local_230 = 0xbe117200;
    local_750 = 0xbe117200be117200;
    uStack_748 = 0xbe117200be117200;
    local_254 = 0x3dd9ed24;
    local_238 = 0x3dd9ed24;
    local_250 = 0x3dd9ed24;
    local_760 = 0x3dd9ed243dd9ed24;
    uStack_758 = 0x3dd9ed243dd9ed24;
    local_274 = 0xbd99b01e;
    local_258 = 0xbd99b01e;
    local_270 = 0xbd99b01e;
    local_770 = 0xbd99b01ebd99b01e;
    uStack_768 = 0xbd99b01ebd99b01e;
    local_294 = 0x3d2edd4e;
    local_278 = 0x3d2edd4e;
    local_290 = 0x3d2edd4e;
    local_780 = 0x3d2edd4e3d2edd4e;
    uStack_778 = 0x3d2edd4e3d2edd4e;
    local_2b4 = 0xbc83a25c;
    local_298 = 0xbc83a25c;
    local_2b0 = 0xbc83a25c;
    local_790 = 0xbc83a25cbc83a25c;
    uStack_788 = 0xbc83a25cbc83a25c;
    local_2d4 = 0x3b3ac537;
    local_2b8 = 0x3b3ac537;
    local_2d0 = 0x3b3ac537;
    local_7a0 = 0x3b3ac5373b3ac537;
    uStack_798 = 0x3b3ac5373b3ac537;
    local_5c0 = local_6d0._0_8_;
    uStack_5b8 = local_6d0._8_8_;
    auVar15._8_8_ = 0x8000000080000000;
    auVar15._0_8_ = 0x8000000080000000;
    local_7b0 = vpand_avx(auVar15,local_6d0);
    local_f0 = local_6d0._0_8_;
    uStack_e8 = local_6d0._8_8_;
    auVar36._8_8_ = 0x8000000080000000;
    auVar36._0_8_ = 0x8000000080000000;
    local_7c0 = vpandn_avx(auVar36,local_6d0);
    local_300 = local_7c0._0_8_;
    uStack_2f8 = local_7c0._8_8_;
    auVar34._8_8_ = 0x3f8000003f800000;
    auVar34._0_8_ = 0x3f8000003f800000;
    local_7d0 = vcmpps_avx(auVar34,local_7c0,1);
    local_5d0 = local_7d0._0_8_;
    uStack_5c8 = local_7d0._8_8_;
    auVar14._8_8_ = 0xbf800000bf800000;
    auVar14._0_8_ = 0xbf800000bf800000;
    local_310 = vpand_avx(local_7d0,auVar14);
    local_100 = local_7d0._0_8_;
    uStack_f8 = local_7d0._8_8_;
    local_110 = local_7c0._0_8_;
    uStack_108 = local_7c0._8_8_;
    local_320 = vpandn_avx(local_7d0,local_7c0);
    local_630 = vpor_avx(local_310,local_320);
    local_5f0 = local_7d0._0_8_;
    uStack_5e8 = local_7d0._8_8_;
    local_600 = local_7c0._0_8_;
    uStack_5f8 = local_7c0._8_8_;
    local_330 = vpand_avx(local_7d0,local_7c0);
    local_120 = local_7d0._0_8_;
    uStack_118 = local_7d0._8_8_;
    auVar35._8_8_ = 0x3f8000003f800000;
    auVar35._0_8_ = 0x3f8000003f800000;
    local_340 = vpandn_avx(local_7d0,auVar35);
    local_640 = vpor_avx(local_330,local_340);
    local_7e0 = vdivps_avx(local_630,local_640);
    local_660 = local_7e0._0_8_;
    uStack_658 = local_7e0._8_8_;
    local_650._0_4_ = local_7e0._0_4_;
    local_650._4_4_ = local_7e0._4_4_;
    uStack_648._0_4_ = local_7e0._8_4_;
    uStack_648._4_4_ = local_7e0._12_4_;
    local_7f0 = (float)local_650 * (float)local_650;
    fStack_7ec = local_650._4_4_ * local_650._4_4_;
    fStack_7e8 = (float)uStack_648 * (float)uStack_648;
    fStack_7e4 = uStack_648._4_4_ * uStack_648._4_4_;
    local_680 = CONCAT44(fStack_7ec,local_7f0);
    uStack_678 = CONCAT44(fStack_7e4,fStack_7e8);
    local_800 = local_7f0 * local_7f0;
    fStack_7fc = fStack_7ec * fStack_7ec;
    fStack_7f8 = fStack_7e8 * fStack_7e8;
    fStack_7f4 = fStack_7e4 * fStack_7e4;
    local_578 = &local_800;
    local_4f0 = &local_790;
    local_4f8 = &local_770;
    local_4c0 = CONCAT44(fStack_7fc,local_800);
    uStack_4b8 = CONCAT44(fStack_7f4,fStack_7f8);
    auVar61._4_4_ = fStack_7fc;
    auVar61._0_4_ = local_800;
    auVar61._8_4_ = fStack_7f8;
    auVar61._12_4_ = fStack_7f4;
    local_4d0 = 0xbc83a25cbc83a25c;
    uStack_4c8 = 0xbc83a25cbc83a25c;
    auVar70._8_8_ = 0xbc83a25cbc83a25c;
    auVar70._0_8_ = 0xbc83a25cbc83a25c;
    local_4e0 = 0xbd99b01ebd99b01e;
    uStack_4d8 = 0xbd99b01ebd99b01e;
    auVar72._8_8_ = 0xbd99b01ebd99b01e;
    auVar72._0_8_ = 0xbd99b01ebd99b01e;
    local_840 = vfmadd213ps_fma(auVar70,auVar61,auVar72);
    local_508 = local_840;
    local_510 = &local_750;
    local_490 = CONCAT44(fStack_7fc,local_800);
    uStack_488 = CONCAT44(fStack_7f4,fStack_7f8);
    auVar62._4_4_ = fStack_7fc;
    auVar62._0_4_ = local_800;
    auVar62._8_4_ = fStack_7f8;
    auVar62._12_4_ = fStack_7f4;
    local_4a0 = local_840._0_8_;
    uStack_498 = local_840._8_8_;
    local_4b0 = 0xbe117200be117200;
    uStack_4a8 = 0xbe117200be117200;
    auVar74._8_8_ = 0xbe117200be117200;
    auVar74._0_8_ = 0xbe117200be117200;
    local_830 = vfmadd213ps_fma(local_840,auVar62,auVar74);
    local_520 = local_830;
    local_528 = &local_730;
    local_460 = CONCAT44(fStack_7fc,local_800);
    uStack_458 = CONCAT44(fStack_7f4,fStack_7f8);
    auVar63._4_4_ = fStack_7fc;
    auVar63._0_4_ = local_800;
    auVar63._8_4_ = fStack_7f8;
    auVar63._12_4_ = fStack_7f4;
    local_470 = local_830._0_8_;
    uStack_468 = local_830._8_8_;
    local_480 = 0xbeaaaa53beaaaa53;
    uStack_478 = 0xbeaaaa53beaaaa53;
    auVar76._8_8_ = 0xbeaaaa53beaaaa53;
    auVar76._0_8_ = 0xbeaaaa53beaaaa53;
    local_820 = vfmadd213ps_fma(local_830,auVar63,auVar76);
    local_538 = &local_7a0;
    local_540 = &local_780;
    local_430 = CONCAT44(fStack_7fc,local_800);
    uStack_428 = CONCAT44(fStack_7f4,fStack_7f8);
    auVar64._4_4_ = fStack_7fc;
    auVar64._0_4_ = local_800;
    auVar64._8_4_ = fStack_7f8;
    auVar64._12_4_ = fStack_7f4;
    local_440 = 0x3b3ac5373b3ac537;
    uStack_438 = 0x3b3ac5373b3ac537;
    auVar69._8_8_ = 0x3b3ac5373b3ac537;
    auVar69._0_8_ = 0x3b3ac5373b3ac537;
    local_450 = 0x3d2edd4e3d2edd4e;
    uStack_448 = 0x3d2edd4e3d2edd4e;
    auVar71._8_8_ = 0x3d2edd4e3d2edd4e;
    auVar71._0_8_ = 0x3d2edd4e3d2edd4e;
    local_880 = vfmadd213ps_fma(auVar69,auVar64,auVar71);
    local_550 = local_880;
    local_558 = &local_760;
    local_400 = CONCAT44(fStack_7fc,local_800);
    uStack_3f8 = CONCAT44(fStack_7f4,fStack_7f8);
    auVar65._4_4_ = fStack_7fc;
    auVar65._0_4_ = local_800;
    auVar65._8_4_ = fStack_7f8;
    auVar65._12_4_ = fStack_7f4;
    local_410 = local_880._0_8_;
    uStack_408 = local_880._8_8_;
    local_420 = 0x3dd9ed243dd9ed24;
    uStack_418 = 0x3dd9ed243dd9ed24;
    auVar73._8_8_ = 0x3dd9ed243dd9ed24;
    auVar73._0_8_ = 0x3dd9ed243dd9ed24;
    local_870 = vfmadd213ps_fma(local_880,auVar65,auVar73);
    local_568 = local_870;
    local_570 = &local_740;
    local_3d0 = CONCAT44(fStack_7fc,local_800);
    uStack_3c8 = CONCAT44(fStack_7f4,fStack_7f8);
    auVar66._4_4_ = fStack_7fc;
    auVar66._0_4_ = local_800;
    auVar66._8_4_ = fStack_7f8;
    auVar66._12_4_ = fStack_7f4;
    local_3e0 = local_870._0_8_;
    uStack_3d8 = local_870._8_8_;
    local_3f0 = 0x3e4cb9743e4cb974;
    uStack_3e8 = 0x3e4cb9743e4cb974;
    auVar75._8_8_ = 0x3e4cb9743e4cb974;
    auVar75._0_8_ = 0x3e4cb9743e4cb974;
    local_860 = vfmadd213ps_fma(local_870,auVar66,auVar75);
    local_580 = local_860;
    local_588 = &local_720;
    local_3a0 = CONCAT44(fStack_7fc,local_800);
    uStack_398 = CONCAT44(fStack_7f4,fStack_7f8);
    auVar67._4_4_ = fStack_7fc;
    auVar67._0_4_ = local_800;
    auVar67._8_4_ = fStack_7f8;
    auVar67._12_4_ = fStack_7f4;
    local_3b0 = local_860._0_8_;
    uStack_3a8 = local_860._8_8_;
    local_3c0 = 0x3f8000003f800000;
    uStack_3b8 = 0x3f8000003f800000;
    auVar77._8_8_ = 0x3f8000003f800000;
    auVar77._0_8_ = 0x3f8000003f800000;
    local_850 = vfmadd213ps_fma(local_860,auVar67,auVar77);
    local_590 = &local_7f0;
    local_598 = local_820;
    local_5a0 = local_850;
    local_370 = CONCAT44(fStack_7ec,local_7f0);
    uStack_368 = CONCAT44(fStack_7e4,fStack_7e8);
    auVar68._4_4_ = fStack_7ec;
    auVar68._0_4_ = local_7f0;
    auVar68._8_4_ = fStack_7e8;
    auVar68._12_4_ = fStack_7e4;
    local_380 = local_820._0_8_;
    uStack_378 = local_820._8_8_;
    local_390 = local_850._0_8_;
    uStack_388 = local_850._8_8_;
    local_810 = vfmadd213ps_fma(local_820,auVar68,local_850);
    local_6a0 = local_7e0._0_8_;
    uStack_698 = local_7e0._8_8_;
    local_690._0_4_ = local_810._0_4_;
    local_690._4_4_ = local_810._4_4_;
    uStack_688._0_4_ = local_810._8_4_;
    uStack_688._4_4_ = local_810._12_4_;
    local_6b0 = (float)local_690 * (float)local_650;
    fStack_6ac = local_690._4_4_ * local_650._4_4_;
    fStack_6a8 = (float)uStack_688 * (float)uStack_648;
    fStack_6a4 = uStack_688._4_4_ * uStack_648._4_4_;
    local_610 = local_7d0._0_8_;
    uStack_608 = local_7d0._8_8_;
    auVar13._8_8_ = 0x3fc90fdb3fc90fdb;
    auVar13._0_8_ = 0x3fc90fdb3fc90fdb;
    _local_6c0 = vpand_avx(local_7d0,auVar13);
    local_350 = local_6b0 + (float)local_6c0._0_4_;
    fStack_34c = fStack_6ac + (float)local_6c0._4_4_;
    fStack_348 = fStack_6a8 + fStack_6b8;
    fStack_344 = fStack_6a4 + fStack_6b4;
    local_360 = local_7b0._0_8_;
    uStack_358 = local_7b0._8_8_;
    auVar33._4_4_ = fStack_34c;
    auVar33._0_4_ = local_350;
    auVar33._8_4_ = fStack_348;
    auVar33._12_4_ = fStack_344;
    _local_ba0 = vpor_avx(auVar33,local_7b0);
    local_bb0._0_4_ = local_c70._0_4_;
    local_bb0._4_4_ = local_c70._4_4_;
    uStack_ba8._0_4_ = local_c70._8_4_;
    uStack_ba8._4_4_ = local_c70._12_4_;
    local_c80 = (float)local_ba0._0_4_ + (float)local_bb0;
    fStack_c7c = (float)local_ba0._4_4_ + local_bb0._4_4_;
    fStack_c78 = fStack_b98 + (float)uStack_ba8;
    fStack_c74 = fStack_b94 + uStack_ba8._4_4_;
    local_9e0 = local_c50._0_8_;
    uStack_9d8 = local_c50._8_8_;
    auVar11._8_8_ = 0x40490fdb40490fdb;
    auVar11._0_8_ = 0x40490fdb40490fdb;
    local_9a0 = vpor_avx(local_c50,auVar11);
    local_c90 = vcmpps_avx(local_9a0,ZEXT816(0),1);
    local_b20 = local_c30._0_8_;
    uStack_b18 = local_c30._8_8_;
    local_a00 = local_c60._0_8_;
    uStack_9f8 = local_c60._8_8_;
    auVar10._8_8_ = 0x3fc90fdb3fc90fdb;
    auVar10._0_8_ = 0x3fc90fdb3fc90fdb;
    local_b30 = vpor_avx(local_c60,auVar10);
    local_a40 = vpand_avx(local_c30,local_b30);
    local_a0 = local_c30._0_8_;
    uStack_98 = local_c30._8_8_;
    local_b40 = local_c90._0_8_;
    uStack_b38 = local_c90._8_8_;
    auVar3._8_8_ = 0x40490fdb40490fdb;
    auVar3._0_8_ = 0x40490fdb40490fdb;
    local_a20 = vpand_avx(local_c90,auVar3);
    local_80 = local_c90._0_8_;
    uStack_78 = local_c90._8_8_;
    local_a30 = vpandn_avx(local_c90,ZEXT816(0));
    local_b0 = vpor_avx(local_a20,local_a30);
    local_a50 = vpandn_avx(local_c30,local_b0);
    local_ca0 = vpor_avx(local_a40,local_a50);
    local_b60 = local_c40._0_8_;
    uStack_b58 = local_c40._8_8_;
    local_b70 = CONCAT44(fStack_c7c,local_c80);
    uStack_b68 = CONCAT44(fStack_c74,fStack_c78);
    auVar79._8_8_ = uStack_b68;
    auVar79._0_8_ = local_b70;
    local_a60 = vpand_avx(local_c40,auVar79);
    local_c0 = local_c40._0_8_;
    uStack_b8 = local_c40._8_8_;
    local_d0 = local_ca0._0_8_;
    uStack_c8 = local_ca0._8_8_;
    auVar79 = vpternlogq_avx512vl(local_c40,local_c40,local_c40,0xf);
    local_a70 = vpand_avx(auVar79,local_ca0);
    auVar79 = vpor_avx(local_a60,local_a70);
    local_2620 = auVar79._0_8_;
    uStackY_2618 = auVar79._8_8_;
    *(undefined8 *)*local_24a8 = local_2620;
    *(undefined8 *)(*local_24a8 + 8) = uStackY_2618;
    local_24a0 = (undefined1 (*) [32])(*local_24a0 + 0x10);
    local_24a8 = (undefined1 (*) [64])(*local_24a8 + 0x10);
    local_bc0 = local_2610;
    uStack_bb8 = uStackY_2608;
    local_bb0 = local_c70._0_8_;
    uStack_ba8 = local_c70._8_8_;
    local_b90 = local_bd0;
    uStack_b88 = uStack_bc8;
    local_b80 = local_2610;
    uStack_b78 = uStackY_2608;
    local_b50 = local_c00;
    uStack_b48 = uStack_bf8;
    local_af0 = local_bf0;
    uStack_ae8 = uStack_be8;
    local_ad0 = local_2610;
    uStack_ac8 = uStackY_2608;
    local_ac0 = local_bf0;
    uStack_ab8 = uStack_be8;
    local_ab0 = local_bd0;
    uStack_aa8 = uStack_bc8;
    local_aa0 = local_bf0;
    uStack_a98 = uStack_be8;
    local_a10 = local_c10;
    uStack_a08 = uStack_c08;
    local_9f0 = local_c00;
    uStack_9e8 = uStack_bf8;
    local_9d0 = local_c00;
    uStack_9c8 = uStack_bf8;
    local_9b0 = local_be0;
    uStack_9a8 = uStack_bd8;
    local_990 = local_be0;
    uStack_988 = uStack_bd8;
    local_980 = local_2610;
    uStack_978 = uStackY_2608;
    local_970 = local_be0;
    uStack_968 = uStack_bd8;
    local_960 = local_bd0;
    uStack_958 = uStack_bc8;
    uStack_93c = local_940;
    uStack_938 = local_940;
    uStack_934 = local_940;
    uStack_91c = local_920;
    uStack_918 = local_920;
    uStack_914 = local_920;
    uStack_8fc = local_900;
    uStack_8f8 = local_900;
    uStack_8f4 = local_900;
    uStack_8dc = local_8e0;
    uStack_8d8 = local_8e0;
    uStack_8d4 = local_8e0;
    local_8c0 = local_be0;
    uStack_8b8 = uStack_bd8;
    local_8b0 = local_2610;
    uStack_8a8 = uStackY_2608;
    local_8a0 = local_be0;
    uStack_898 = uStack_bd8;
    local_890 = local_bd0;
    uStack_888 = uStack_bc8;
    local_690 = local_810._0_8_;
    uStack_688 = local_810._8_8_;
    local_670 = local_680;
    uStack_668 = uStack_678;
    local_650 = local_660;
    uStack_648 = uStack_658;
    local_620 = local_710;
    uStack_618 = uStack_708;
    local_5e0 = local_700;
    uStack_5d8 = uStack_6f8;
    local_5b0 = local_6e0;
    uStack_5a8 = uStack_6d8;
    local_560 = local_578;
    local_548 = local_578;
    local_530 = local_578;
    local_518 = local_578;
    local_500 = local_578;
    local_4e8 = local_578;
    local_2f0 = local_6f0;
    uStack_2e8 = uStack_6e8;
    uStack_2cc = local_2d0;
    uStack_2c8 = local_2d0;
    uStack_2c4 = local_2d0;
    uStack_2ac = local_2b0;
    uStack_2a8 = local_2b0;
    uStack_2a4 = local_2b0;
    uStack_28c = local_290;
    uStack_288 = local_290;
    uStack_284 = local_290;
    uStack_26c = local_270;
    uStack_268 = local_270;
    uStack_264 = local_270;
    uStack_24c = local_250;
    uStack_248 = local_250;
    uStack_244 = local_250;
    uStack_22c = local_230;
    uStack_228 = local_230;
    uStack_224 = local_230;
    uStack_20c = local_210;
    uStack_208 = local_210;
    uStack_204 = local_210;
    uStack_1ec = local_1f0;
    uStack_1e8 = local_1f0;
    uStack_1e4 = local_1f0;
    uStack_1cc = local_1d0;
    uStack_1c8 = local_1d0;
    uStack_1c4 = local_1d0;
    uStack_1ac = local_1b0;
    uStack_1a8 = local_1b0;
    uStack_1a4 = local_1b0;
    uStack_18c = local_190;
    uStack_188 = local_190;
    uStack_184 = local_190;
    uStack_16c = local_170;
    uStack_168 = local_170;
    uStack_164 = local_170;
    uStack_14c = local_150;
    uStack_148 = local_150;
    uStack_144 = local_150;
    local_130 = local_6f0;
    uStack_128 = uStack_6e8;
    local_e0 = local_6e0;
    uStack_d8 = uStack_6d8;
    local_90 = local_be0;
    uStack_88 = uStack_bd8;
  }
  for (; local_24bc < local_24ac; local_24bc = local_24bc + 1) {
    local_58 = local_24b1;
    local_60 = &local_24b8;
    local_68 = local_24a0;
    fVar81 = atan2f(*(float *)*local_24a0,local_24b8);
    *(float *)*local_24a8 = fVar81;
    local_24a0 = (undefined1 (*) [32])(*local_24a0 + 4);
    local_24a8 = (undefined1 (*) [64])(*local_24a8 + 4);
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_a(const float* ptr, const float* ptr1, float* outptr, int size, int elempack)
{
    const Op op;

    const float a = *ptr;

    int i = 0;
#if __SSE2__
    __m128 _a_128 = (elempack == 4) ? _mm_loadu_ps(ptr) : _mm_set1_ps(a);
#if __AVX__
    __m256 _a_256 = (elempack == 8) ? _mm256_loadu_ps(ptr) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a_128), _a_128, 1);
#if __AVX512F__
    __m512 _a_512 = (elempack == 16) ? _mm512_loadu_ps(ptr) : _mm512_insertf32x8(_mm512_castps256_ps512(_a_256), _a_256, 1);
    for (; i + 15 < size; i += 16)
    {
        __m512 _b = _mm512_loadu_ps(ptr1);
        __m512 _outp = op.func_pack16(_a_512, _b);
        _mm512_storeu_ps(outptr, _outp);
        ptr1 += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    for (; i + 7 < size; i += 8)
    {
        __m256 _b = _mm256_loadu_ps(ptr1);
        __m256 _outp = op.func_pack8(_a_256, _b);
        _mm256_storeu_ps(outptr, _outp);
        ptr1 += 8;
        outptr += 8;
    }
#endif // __AVX__
    for (; i + 3 < size; i += 4)
    {
        __m128 _b = _mm_loadu_ps(ptr1);
        __m128 _outp = op.func_pack4(_a_128, _b);
        _mm_storeu_ps(outptr, _outp);
        ptr1 += 4;
        outptr += 4;
    }
#endif // __SSE2__
    for (; i < size; i++)
    {
        *outptr = op.func(a, *ptr1);
        ptr1 += 1;
        outptr += 1;
    }
}